

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable.cpp
# Opt level: O1

void copy_test(void)

{
  trackable_ptr_base *ptr;
  trackable_ptr_base *ptVar1;
  undefined8 extraout_RAX;
  trackable_base tVar2;
  long lVar3;
  int line;
  char *expr;
  trackable_base local_58;
  undefined4 local_50;
  trackable_base local_48;
  undefined4 local_40;
  trackable_ptr_base local_38;
  trackable_ptr_base local_20;
  
  local_38.obj = &local_58;
  local_20.obj = &local_48;
  local_50 = 2;
  local_48.first_ptr = &local_20;
  local_20.next = (trackable_ptr_base *)0x0;
  local_20.prev = (trackable_ptr_base *)0x0;
  local_58.first_ptr = &local_38;
  local_38.next = (trackable_ptr_base *)0x0;
  local_38.prev = (trackable_ptr_base *)0x0;
  local_40 = 2;
  if ((local_20.obj == (trackable_base *)0x0) || (&stack0x00000000 == (undefined1 *)0x58)) {
    __assert_fail("*this",
                  "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/include/tower120/trackable_ptr.h"
                  ,0xf0,
                  "T *tower120::trackable_ptr<test_struct>::operator->() const [T = test_struct]");
  }
  if (local_20.obj == &local_58) {
    line = 0x29;
    expr = "p1 != p2";
  }
  else {
    line = 0x2b;
    expr = "ptrs_count(d1) == 1";
    if (local_48.first_ptr != (trackable_ptr_base *)0x0) {
      lVar3 = 1;
      ptVar1 = local_48.first_ptr;
      do {
        ptVar1 = ptVar1->next;
        lVar3 = lVar3 + -1;
      } while (ptVar1 != (trackable_ptr_base *)0x0);
      if (lVar3 == 0) {
        line = 0x2c;
        expr = "ptrs_count(d2) == 1";
        if (local_58.first_ptr != (trackable_ptr_base *)0x0) {
          lVar3 = 1;
          ptVar1 = local_58.first_ptr;
          do {
            ptVar1 = ptVar1->next;
            lVar3 = lVar3 + -1;
          } while (ptVar1 != (trackable_ptr_base *)0x0);
          if (lVar3 == 0) {
            local_38.obj = &local_58;
            tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_38);
            tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_20);
            for (; local_58.first_ptr != (trackable_ptr_base *)0x0;
                local_58.first_ptr = (local_58.first_ptr)->next) {
              (local_58.first_ptr)->obj = (trackable_base *)0x0;
            }
            for (; local_48.first_ptr != (trackable_ptr_base *)0x0;
                local_48.first_ptr = (local_48.first_ptr)->next) {
              (local_48.first_ptr)->obj = (trackable_base *)0x0;
            }
            return;
          }
        }
      }
    }
  }
  local_38.obj = &local_58;
  detail::require_failed
            (expr,
             "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
             ,line);
  tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_38);
  tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_20);
  local_50 = 0xffffffff;
  for (tVar2.first_ptr = local_58.first_ptr; tVar2.first_ptr != (trackable_ptr_base *)0x0;
      tVar2.first_ptr = (tVar2.first_ptr)->next) {
    (tVar2.first_ptr)->obj = (trackable_base *)0x0;
  }
  local_40 = 0xffffffff;
  for (tVar2.first_ptr = local_48.first_ptr; tVar2.first_ptr != (trackable_ptr_base *)0x0;
      tVar2.first_ptr = (tVar2.first_ptr)->next) {
    (tVar2.first_ptr)->obj = (trackable_base *)0x0;
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void copy_test(){
    trackable<test_struct> d1{{1}};
    trackable<test_struct> d2{{2}};

    trackable_ptr<test_struct> p1 {&d1};
    trackable_ptr<test_struct> p2 {&d2};
    REQUIRE(p1->i == 1);
    REQUIRE(p2->i == 2);
    d1 = d2;
    REQUIRE(p1->i == 2);
    REQUIRE(p2->i == 2);

    REQUIRE(p1 != p2);

    REQUIRE(ptrs_count(d1) == 1);
    REQUIRE(ptrs_count(d2) == 1);
}